

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharContent.cpp
# Opt level: O0

vector<CharContent,_std::allocator<CharContent>_> * __thiscall
CharContent::split(vector<CharContent,_std::allocator<CharContent>_> *__return_storage_ptr__,
                  CharContent *this,CharContent *s)

{
  size_t sVar1;
  size_t sVar2;
  CharContent local_98;
  CharContent local_60;
  size_t local_38;
  size_t pos;
  size_t start;
  CharContent *local_20;
  CharContent *s_local;
  CharContent *this_local;
  vector<CharContent,_std::allocator<CharContent>_> *ans;
  
  start._7_1_ = 0;
  local_20 = s;
  s_local = this;
  this_local = (CharContent *)__return_storage_ptr__;
  std::vector<CharContent,_std::allocator<CharContent>_>::vector(__return_storage_ptr__);
  pos = 0;
  local_38 = 0;
  while (local_38 = find(this,local_20,pos), local_38 != this->npos) {
    if (pos < local_38) {
      subCharContent(&local_60,this,pos,local_38 - pos);
      std::vector<CharContent,_std::allocator<CharContent>_>::push_back
                (__return_storage_ptr__,&local_60);
      ~CharContent(&local_60);
    }
    sVar1 = local_38;
    sVar2 = length(local_20);
    pos = sVar1 + sVar2;
  }
  if (pos < this->size) {
    subCharContent(&local_98,this,pos,this->size - pos);
    std::vector<CharContent,_std::allocator<CharContent>_>::push_back
              (__return_storage_ptr__,&local_98);
    ~CharContent(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CharContent> CharContent::split(const CharContent &s){
	std::vector<CharContent> ans;
	size_t start=0,pos=0;
	while((pos=this->find(s,start))!=this->npos){
		if(pos>start)
			ans.push_back(this->subCharContent(start,pos-start));
		start=pos+s.length();
	}
	if(start<this->size)
		ans.push_back(this->subCharContent(start,this->size-start));
	return ans;
}